

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O0

void __thiscall
prevector<8U,_int,_unsigned_int,_int>::assign
          (prevector<8U,_int,_unsigned_int,_int> *this,size_type n,int *val)

{
  size_t sVar1;
  prevector<8U,_int,_unsigned_int,_int> *in_RDX;
  uint in_ESI;
  prevector<8U,_int,_unsigned_int,_int> *in_RDI;
  long in_FS_OFFSET;
  size_type in_stack_00000034;
  prevector<8U,_int,_unsigned_int,_int> *in_stack_00000038;
  undefined4 in_stack_ffffffffffffffe8;
  prevector<8U,_int,_unsigned_int,_int> *ppVar2;
  difference_type_conflict pos;
  prevector<8U,_int,_unsigned_int,_int> *this_00;
  
  this_00 = *(prevector<8U,_int,_unsigned_int,_int> **)(in_FS_OFFSET + 0x28);
  ppVar2 = in_RDI;
  clear(in_RDI);
  pos = (difference_type_conflict)((ulong)ppVar2 >> 0x20);
  sVar1 = capacity(in_RDX);
  if (sVar1 < in_ESI) {
    change_capacity(in_stack_00000038,in_stack_00000034);
  }
  in_RDI->_size = in_RDI->_size + in_ESI;
  item_ptr(this_00,pos);
  fill((prevector<8U,_int,_unsigned_int,_int> *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
       (int *)in_RDX,(ptrdiff_t)in_RDI,(int *)0x92b07f);
  if (*(prevector<8U,_int,_unsigned_int,_int> **)(in_FS_OFFSET + 0x28) == this_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void assign(size_type n, const T& val) {
        clear();
        if (capacity() < n) {
            change_capacity(n);
        }
        _size += n;
        fill(item_ptr(0), n, val);
    }